

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O2

double __thiscall cali::StringConverter::to_double(StringConverter *this,bool *okptr)

{
  double dVar1;
  
  dVar1 = std::__cxx11::stod(&this->m_str,(size_t *)0x0);
  if (okptr != (bool *)0x0) {
    *okptr = true;
  }
  return dVar1;
}

Assistant:

double cali::StringConverter::to_double(bool* okptr) const
{
    bool   ok  = false;
    double res = 0;

    try {
        res = std::stod(m_str);
        ok  = true;
    } catch (...) {
        ok = false;
    }

    if (okptr)
        *okptr = ok;

    return res;
}